

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

_compatible_texture_target_pairs *
gl4cts::TextureViewUtilities::getLegalTextureAndViewTargetCombinations(void)

{
  bool bVar1;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_RDI;
  pair<unsigned_int,_unsigned_int> local_3c [3];
  GLenum local_24;
  uint local_20;
  GLenum view_texture_target;
  uint n_compatible_texture_target;
  GLenum original_texture_target;
  uint n_original_texture_target;
  _compatible_texture_target_pairs *result;
  
  original_texture_target._3_1_ = 0;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(in_RDI);
  for (n_compatible_texture_target = 0; n_compatible_texture_target < 0xb;
      n_compatible_texture_target = n_compatible_texture_target + 1) {
    view_texture_target =
         *(GLenum *)(valid_texture_targets + (ulong)n_compatible_texture_target * 4);
    for (local_20 = 0; local_20 < 0xb; local_20 = local_20 + 1) {
      local_24 = *(GLenum *)(valid_texture_targets + (ulong)local_20 * 4);
      bVar1 = isLegalTextureTargetForTextureView(view_texture_target,local_24);
      if (bVar1) {
        std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
                  (local_3c,&view_texture_target,&local_24);
        std::
        vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ::push_back(in_RDI,local_3c);
      }
    }
  }
  return in_RDI;
}

Assistant:

TextureViewUtilities::_compatible_texture_target_pairs TextureViewUtilities::getLegalTextureAndViewTargetCombinations()
{
	_compatible_texture_target_pairs result;

	/* Iterate over all texture targets valid for a glTextureView() call. Consider each one of them as
	 * original texture target.
	 */
	for (unsigned int n_original_texture_target = 0; n_original_texture_target < n_valid_texture_targets;
		 ++n_original_texture_target)
	{
		const glw::GLenum original_texture_target = valid_texture_targets[n_original_texture_target];

		/* Iterate again, but this time consider each texture target as a valid new target */
		for (unsigned int n_compatible_texture_target = 0; n_compatible_texture_target < n_valid_texture_targets;
			 ++n_compatible_texture_target)
		{
			const glw::GLenum view_texture_target = valid_texture_targets[n_compatible_texture_target];

			if (TextureViewUtilities::isLegalTextureTargetForTextureView(original_texture_target, view_texture_target))
			{
				result.push_back(_texture_target_pair(original_texture_target, view_texture_target));
			}
		} /* for (all texture targets that are potentially compatible) */
	}	 /* for (all original texture targets) */

	return result;
}